

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void __thiscall
bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack
          (MRUQueue<bssl::DTLSSentRecord,_32UL> *this,DTLSSentRecord t)

{
  PackedSize<32UL> *pPVar1;
  char *pcVar2;
  ulong uVar3;
  DTLSSentRecord *pDVar4;
  
  uVar3 = (ulong)(this->storage_).size_;
  if (uVar3 < 0x20) {
    if (this->start_ != '\0') {
      __assert_fail("start_ == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                    ,100,
                    "void bssl::MRUQueue<bssl::DTLSSentRecord, 32>::PushBack(T) [T = bssl::DTLSSentRecord, N = 32]"
                   );
    }
    *(long *)((this->storage_).storage_ + uVar3 * 0x18 + 0x10) = t._16_8_;
    pcVar2 = (this->storage_).storage_ + uVar3 * 0x18;
    *(uint64_t *)pcVar2 = t.number.combined_;
    *(undefined8 *)(pcVar2 + 8) = t._8_8_;
    pPVar1 = &(this->storage_).size_;
    *pPVar1 = *pPVar1 + '\x01';
  }
  else {
    pDVar4 = operator[](this,0);
    (pDVar4->number).combined_ = t.number.combined_;
    pDVar4->first_msg = t.first_msg;
    pDVar4->last_msg = t.last_msg;
    *(undefined2 *)&pDVar4->field_0xa = t._10_2_;
    pDVar4->first_msg_start = t.first_msg_start;
    pDVar4->last_msg_end = t.last_msg_end;
    this->start_ = this->start_ + 1 & 0x1f;
  }
  return;
}

Assistant:

void PushBack(T t) {
    if (storage_.size() < N) {
      assert(start_ == 0);
      storage_.PushBack(std::move(t));
    } else {
      (*this)[0] = std::move(t);
      start_ = (start_ + 1) % N;
    }
  }